

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O3

void __thiscall flow::TargetCodeGenerator::visit(TargetCodeGenerator *this,CastInstr *castInstr)

{
  Opcode opc;
  Value *value;
  int iVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  long lVar4;
  undefined1 local_151;
  undefined1 local_150;
  undefined1 local_14f;
  undefined1 local_14e;
  undefined1 local_14d;
  undefined1 local_14c;
  undefined1 local_14b;
  undefined1 local_14a;
  undefined1 local_149;
  LiteralType local_148 [3];
  undefined2 local_13c;
  _Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_flow::Opcode>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_138;
  _Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_flow::Opcode>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_100;
  pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>
  local_c8;
  pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>
  local_88;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined1 local_28 [8];
  
  if (visit(flow::CastInstr&)::map == '\0') {
    iVar1 = __cxa_guard_acquire(&visit(flow::CastInstr&)::map);
    if (iVar1 != 0) {
      local_148[1] = 3;
      local_38 = 0x4600000006;
      uStack_30 = 0x4700000007;
      local_48 = 2;
      uStack_44 = 0x44;
      uStack_40 = 5;
      uStack_3c = 0x45;
      std::
      _Hashtable<flow::LiteralType,std::pair<flow::LiteralType_const,flow::Opcode>,std::allocator<std::pair<flow::LiteralType_const,flow::Opcode>>,std::__detail::_Select1st,std::equal_to<flow::LiteralType>,std::hash<flow::LiteralType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_Hashtable<std::pair<flow::LiteralType_const,flow::Opcode>const*>
                ((_Hashtable<flow::LiteralType,std::pair<flow::LiteralType_const,flow::Opcode>,std::allocator<std::pair<flow::LiteralType_const,flow::Opcode>>,std::__detail::_Select1st,std::equal_to<flow::LiteralType>,std::hash<flow::LiteralType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&local_138,&local_48,local_28,0,&local_149,&local_14a,&local_14b);
      std::
      pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>
      ::pair<flow::LiteralType,_true>
                (&local_c8,local_148 + 1,
                 (unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>
                  *)&local_138);
      local_148[0] = Number;
      local_148[2] = 3;
      local_13c = 0x48;
      std::
      _Hashtable<flow::LiteralType,std::pair<flow::LiteralType_const,flow::Opcode>,std::allocator<std::pair<flow::LiteralType_const,flow::Opcode>>,std::__detail::_Select1st,std::equal_to<flow::LiteralType>,std::hash<flow::LiteralType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_Hashtable<std::pair<flow::LiteralType_const,flow::Opcode>const*>
                ((_Hashtable<flow::LiteralType,std::pair<flow::LiteralType_const,flow::Opcode>,std::allocator<std::pair<flow::LiteralType_const,flow::Opcode>>,std::__detail::_Select1st,std::equal_to<flow::LiteralType>,std::hash<flow::LiteralType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&local_100,local_148 + 2,&local_138,0,&local_14c,&local_14d,&local_14e);
      std::
      pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>
      ::pair<flow::LiteralType,_true>
                (&local_88,local_148,
                 (unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>
                  *)&local_100);
      std::
      _Hashtable<flow::LiteralType,std::pair<flow::LiteralType_const,std::unordered_map<flow::LiteralType,flow::Opcode,std::hash<flow::LiteralType>,std::equal_to<flow::LiteralType>,std::allocator<std::pair<flow::LiteralType_const,flow::Opcode>>>>,std::allocator<std::pair<flow::LiteralType_const,std::unordered_map<flow::LiteralType,flow::Opcode,std::hash<flow::LiteralType>,std::equal_to<flow::LiteralType>,std::allocator<std::pair<flow::LiteralType_const,flow::Opcode>>>>>,std::__detail::_Select1st,std::equal_to<flow::LiteralType>,std::hash<flow::LiteralType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _Hashtable<std::pair<flow::LiteralType_const,std::unordered_map<flow::LiteralType,flow::Opcode,std::hash<flow::LiteralType>,std::equal_to<flow::LiteralType>,std::allocator<std::pair<flow::LiteralType_const,flow::Opcode>>>>const*>
                ((_Hashtable<flow::LiteralType,std::pair<flow::LiteralType_const,std::unordered_map<flow::LiteralType,flow::Opcode,std::hash<flow::LiteralType>,std::equal_to<flow::LiteralType>,std::allocator<std::pair<flow::LiteralType_const,flow::Opcode>>>>,std::allocator<std::pair<flow::LiteralType_const,std::unordered_map<flow::LiteralType,flow::Opcode,std::hash<flow::LiteralType>,std::equal_to<flow::LiteralType>,std::allocator<std::pair<flow::LiteralType_const,flow::Opcode>>>>>,std::__detail::_Select1st,std::equal_to<flow::LiteralType>,std::hash<flow::LiteralType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&visit::map,&local_c8,&local_48,0,&local_14f,&local_150,&local_151);
      lVar4 = 0x48;
      do {
        std::
        _Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_flow::Opcode>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_flow::Opcode>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)((long)&local_c8.first + lVar4));
        lVar4 = lVar4 + -0x40;
      } while (lVar4 != -0x38);
      std::
      _Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_flow::Opcode>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_100);
      std::
      _Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_flow::Opcode>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_138);
      __cxa_atexit(std::
                   unordered_map<flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>_>_>
                   ::~unordered_map,&visit::map,&__dso_handle);
      __cxa_guard_release(&visit(flow::CastInstr&)::map);
    }
  }
  local_c8.first = (castInstr->super_Instr).super_Value.type_;
  value = *(castInstr->super_Instr).operands_.
           super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_c8.first == value->type_) {
    emitLoad(this,value);
  }
  else {
    cVar2 = std::
            _Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>,_std::allocator<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&visit::map._M_h,&local_c8.first);
    if (cVar2.
        super__Node_iterator_base<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      __assert_fail("i != map.end() && \"Cast target type not found.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/TargetCodeGenerator.cc"
                    ,0x200,"virtual void flow::TargetCodeGenerator::visit(CastInstr &)");
    }
    local_c8.first =
         (*(castInstr->super_Instr).operands_.
           super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
           super__Vector_impl_data._M_start)->type_;
    cVar3 = std::
            _Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_flow::Opcode>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_flow::Opcode>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)((long)cVar2.
                             super__Node_iterator_base<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>,_false>
                             ._M_cur + 0x10),&local_c8.first);
    if (cVar3.super__Node_iterator_base<std::pair<const_flow::LiteralType,_flow::Opcode>,_false>.
        _M_cur == (__node_type *)0x0) {
      __assert_fail("k != sub.end() && \"Cast source type not found.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/TargetCodeGenerator.cc"
                    ,0x205,"virtual void flow::TargetCodeGenerator::visit(CastInstr &)");
    }
    opc = *(Opcode *)
           ((long)cVar3.
                  super__Node_iterator_base<std::pair<const_flow::LiteralType,_flow::Opcode>,_false>
                  ._M_cur + 0xc);
    emitLoad(this,*(castInstr->super_Instr).operands_.
                   super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
                   super__Vector_impl_data._M_start);
    emitInstr(this,opc);
    changeStack(this,1,(Value *)castInstr);
  }
  return;
}

Assistant:

void TargetCodeGenerator::visit(CastInstr& castInstr) {
  // map of (target, source, opcode)
  static const std::unordered_map<
      LiteralType,
      std::unordered_map<LiteralType, Opcode>> map = {
        {LiteralType::String, {
          {LiteralType::Number, Opcode::N2S},
          {LiteralType::IPAddress, Opcode::P2S},
          {LiteralType::Cidr, Opcode::C2S},
          {LiteralType::RegExp, Opcode::R2S},
        }},
        {LiteralType::Number, {
          {LiteralType::String, Opcode::S2N},
        }},
      };

  // just alias same-type casts
  if (castInstr.type() == castInstr.source()->type()) {
    emitLoad(castInstr.source());
    return;
  }

  // lookup target type
  const auto i = map.find(castInstr.type());
  assert(i != map.end() && "Cast target type not found.");

  // lookup source type
  const auto& sub = i->second;
  auto k = sub.find(castInstr.source()->type());
  assert(k != sub.end() && "Cast source type not found.");
  Opcode op = k->second;

  // emit instruction
  emitLoad(castInstr.source());
  emitInstr(op);
  changeStack(1, &castInstr);
}